

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ml_sse3.c
# Opt level: O2

void av1_nn_propagate_4to4_sse3(float *inputs,float *weights,__m128 *outputs,int num_inputs)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  long lVar12;
  __m128 hadd [2];
  
  fVar2 = *inputs;
  fVar3 = inputs[1];
  fVar4 = inputs[2];
  fVar5 = inputs[3];
  for (lVar12 = 0; lVar12 != 0x20; lVar12 = lVar12 + 0x10) {
    fVar6 = weights[2];
    fVar7 = weights[3];
    pfVar1 = weights + num_inputs;
    fVar8 = *pfVar1;
    fVar9 = pfVar1[1];
    fVar10 = pfVar1[2];
    fVar11 = pfVar1[3];
    *(float *)((long)hadd[0] + lVar12) = *weights * fVar2 + weights[1] * fVar3;
    *(float *)((long)hadd[0] + lVar12 + 4) = fVar6 * fVar4 + fVar7 * fVar5;
    *(float *)((long)hadd[0] + lVar12 + 8) = fVar8 * fVar2 + fVar9 * fVar3;
    *(float *)((long)hadd[0] + lVar12 + 0xc) = fVar10 * fVar4 + fVar11 * fVar5;
    weights = weights + (long)num_inputs * 2;
  }
  fVar2 = (*outputs)[1];
  fVar3 = (*outputs)[2];
  fVar4 = (*outputs)[3];
  (*outputs)[0] = hadd[0][0] + hadd[0][1] + (*outputs)[0];
  (*outputs)[1] = hadd[0][2] + hadd[0][3] + fVar2;
  (*outputs)[2] = hadd[1][0] + hadd[1][1] + fVar3;
  (*outputs)[3] = hadd[1][2] + hadd[1][3] + fVar4;
  return;
}

Assistant:

void av1_nn_propagate_4to4_sse3(const float *const inputs,
                                const float *const weights,
                                __m128 *const outputs, const int num_inputs) {
  const __m128 inputs128 = _mm_loadu_ps(inputs);

  __m128 hadd[2];
  for (int i = 0; i < 2; i++) {  // For each pair of outputs
    const __m128 weight0 = _mm_loadu_ps(&weights[2 * i * num_inputs]);
    const __m128 mul0 = _mm_mul_ps(weight0, inputs128);
    const __m128 weight1 = _mm_loadu_ps(&weights[(2 * i + 1) * num_inputs]);
    const __m128 mul1 = _mm_mul_ps(weight1, inputs128);
    hadd[i] = _mm_hadd_ps(mul0, mul1);
  }
  // hadd[0] = [7+6 5+4 3+2 1+0] (weight indices)
  // hadd[1] = [15+14 13+12 11+10 9+8]

  const __m128 hh = _mm_hadd_ps(hadd[0], hadd[1]);
  // [15+14+13+12 11+10+9+8 7+6+5+4 3+2+1+0]

  *outputs = _mm_add_ps(*outputs, hh);
}